

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int doTests(string *name,float ref)

{
  pointer ptVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ptVar1 = backends_abi_cxx11_.
           super__Vector_base<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (__rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               backends_abi_cxx11_.
               super__Vector_base<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __rhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ptVar1;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &__rhs[1]._M_string_length) {
    indk::NeuralNet::doReset(NN);
    lVar2 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x32
    ;
    *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::operator+(&local_90,name," (");
    std::operator+(&local_70,&local_90,__rhs);
    std::operator+(&local_50,&local_70,"): ");
    std::operator<<((ostream *)&std::cout,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    indk::System::setComputeBackend
              (*(int *)((long)&__rhs[1]._M_dataplus._M_p + 4),*(int *)&__rhs[1]._M_dataplus._M_p);
    iVar3 = doTest(ref);
    iVar4 = iVar4 + iVar3;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return iVar4;
}

Assistant:

int doTests(const std::string& name, float ref) {
    int count = 0;

    for (auto &b: backends) {
        NN -> doReset();
        std::cout << std::setw(50) << std::left << name+" ("+std::get<2>(b)+"): ";
        indk::System::setComputeBackend(std::get<0>(b), std::get<1>(b));
        count += doTest(ref);
    }
    std::cout << std::endl;

    return count;
}